

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

bool sptk::ReadStream<unsigned_short>
               (bool zero_padding,int stream_skip,int read_point,int read_size,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *sequence_to_read,
               istream *input_stream,int *actual_read_size)

{
  int iVar1;
  uint uVar2;
  ulong __new_size;
  uint uVar3;
  int iVar4;
  double dVar5;
  
  if ((((input_stream != (istream *)0x0 &&
        sequence_to_read != (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0) &&
        (0 < read_size && -1 < (read_point | stream_skip))) &&
      (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) == 0)) &&
     ((stream_skip < 1 ||
      (std::istream::ignore((long)input_stream),
      ((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) == 0)))) {
    __new_size = (ulong)(uint)(read_size + read_point);
    if ((ulong)(*(long *)(sequence_to_read + 8) - *(long *)sequence_to_read >> 1) < __new_size) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (sequence_to_read,__new_size);
    }
    std::istream::read((char *)input_stream,(ulong)(uint)read_point * 2 + *(long *)sequence_to_read)
    ;
    iVar1 = *(int *)(input_stream + 8);
    if (actual_read_size != (int *)0x0) {
      *actual_read_size = iVar1 / 2;
    }
    uVar3 = 5;
    iVar4 = read_size * 2 - iVar1;
    if (iVar4 == 0) {
LAB_0010aa58:
      return (*(uint *)(input_stream + *(long *)(*(long *)input_stream + -0x18) + 0x20) & uVar3) ==
             0;
    }
    if (zero_padding && 0 < iVar1) {
      dVar5 = ceil((double)iVar4 * 0.5);
      uVar2 = (uint)dVar5;
      if (-1 < (int)uVar2) {
        uVar3 = 1;
        if (uVar2 != 0) {
          memset((void *)(__new_size * 2 + *(long *)sequence_to_read + (ulong)uVar2 * -2),0,
                 (ulong)uVar2 * 2);
        }
        goto LAB_0010aa58;
      }
    }
  }
  return false;
}

Assistant:

bool ReadStream(bool zero_padding, int stream_skip, int read_point,
                int read_size, std::vector<T>* sequence_to_read,
                std::istream* input_stream, int* actual_read_size) {
  if (stream_skip < 0 || read_point < 0 || read_size <= 0 ||
      NULL == sequence_to_read || NULL == input_stream || input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof((*sequence_to_read)[0]));

  if (0 < stream_skip) {
    input_stream->ignore(type_byte * stream_skip);
    if (input_stream->eof()) return false;
  }

  const int end(read_point + read_size);
  if (sequence_to_read->size() < static_cast<std::size_t>(end)) {
    sequence_to_read->resize(end);
  }

  const int num_read_bytes(type_byte * read_size);
  input_stream->read(
      reinterpret_cast<char*>(&((*sequence_to_read)[0]) + read_point),
      num_read_bytes);

  const int gcount(static_cast<int>(input_stream->gcount()));
  if (NULL != actual_read_size) {
    *actual_read_size = gcount / type_byte;
  }

  if (num_read_bytes == gcount) {
    return !input_stream->fail();
  } else if (zero_padding && 0 < gcount) {
    // Use std::ceil to zero incomplete data
    // as gcount may not be a multiple of sizeof(double).
    const int num_zeros(static_cast<int>(
        std::ceil(static_cast<double>(num_read_bytes - gcount) / type_byte)));
    if (num_zeros < 0) {
      return false;  // Something wrong!
    }

    std::fill_n(sequence_to_read->begin() + end - num_zeros, num_zeros,
                static_cast<T>(0));

    return !input_stream->bad();
  }

  return false;
}